

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O1

void __thiscall
agge::tests::PathStrokeTests::StrokerGeneratesSinglePointSequenceForOpenSegment
          (PathStrokeTests *this)

{
  size_t sVar1;
  cap *pcVar2;
  join *pjVar3;
  stroke s;
  undefined1 local_248 [8];
  int local_240;
  point local_23c;
  undefined8 local_230;
  int local_228;
  point local_224;
  point local_218;
  point local_20c;
  real_t rStack_200;
  real_t rStack_1fc;
  int iStack_1f8;
  point local_1f4;
  point local_1e8;
  undefined8 local_1dc;
  undefined4 local_1d4;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined8 local_1c4;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined8 local_1ac;
  undefined4 local_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined8 local_194;
  undefined4 local_18c;
  stroke local_180;
  undefined1 local_128 [44];
  int local_fc;
  pointer local_f8;
  int local_f0;
  pointer local_ec;
  int local_e4;
  pointer local_e0;
  int local_d8;
  pointer local_d4;
  int local_cc;
  point local_c8;
  point local_bc;
  point local_b0;
  point local_a4;
  point local_98;
  point local_8c;
  point local_80;
  point local_74;
  string local_60;
  LocationInfo local_40;
  
  stroke::stroke(&local_180);
  stroke::add_vertex(&local_180,0.0,0.0,1);
  stroke::add_vertex(&local_180,0.0,1.0,2);
  sVar1 = this->amount_alive;
  this->amount_alive = sVar1 + 1;
  pcVar2 = (cap *)operator_new(0x10);
  pcVar2->_vptr_cap = (_func_int **)&PTR__counted_001c2110;
  pcVar2[1]._vptr_cap = (_func_int **)this;
  this->amount_alive = sVar1 + 2;
  pcVar2->_vptr_cap = (_func_int **)&PTR__counted_001c20e8;
  if (local_180._cap != (cap *)0x0) {
    (*(local_180._cap)->_vptr_cap[1])();
  }
  sVar1 = this->amount_alive;
  local_180._cap = pcVar2;
  pjVar3 = (join *)operator_new(0x10);
  pjVar3->_vptr_join = (_func_int **)&PTR__counted_001c2160;
  pjVar3[1]._vptr_join = (_func_int **)this;
  this->amount_alive = sVar1 + 1;
  pjVar3->_vptr_join = (_func_int **)&PTR__counted_001c2138;
  if (local_180._join != (join *)0x0) {
    (*(local_180._join)->_vptr_join[1])();
  }
  this->amount_alive = this->amount_alive - 1;
  local_180._join = pjVar3;
  stroke::width(&local_180,4.0);
  local_1e8.command = 0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_c8.command = stroke::vertex(&local_180,&local_1e8.x,&local_1e8.y);
  local_c8.x = local_1e8.x;
  local_c8.y = local_1e8.y;
  local_1e8.command = 0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_bc.command = stroke::vertex(&local_180,&local_1e8.x,&local_1e8.y);
  local_bc.x = local_1e8.x;
  local_bc.y = local_1e8.y;
  local_1e8.command = 0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_b0.command = stroke::vertex(&local_180,&local_1e8.x,&local_1e8.y);
  local_b0.x = local_1e8.x;
  local_b0.y = local_1e8.y;
  local_1e8.command = 0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_a4.command = stroke::vertex(&local_180,&local_1e8.x,&local_1e8.y);
  local_a4.x = local_1e8.x;
  local_a4.y = local_1e8.y;
  local_1e8.command = 0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_98.command = stroke::vertex(&local_180,&local_1e8.x,&local_1e8.y);
  local_98.x = local_1e8.x;
  local_98.y = local_1e8.y;
  local_1e8.command = 0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_8c.command = stroke::vertex(&local_180,&local_1e8.x,&local_1e8.y);
  local_8c.x = local_1e8.x;
  local_8c.y = local_1e8.y;
  local_1e8.command = 0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_80.command = stroke::vertex(&local_180,&local_1e8.x,&local_1e8.y);
  local_80.x = local_1e8.x;
  local_80.y = local_1e8.y;
  local_1e8.command = 0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_74.command = stroke::vertex(&local_180,&local_1e8.x,&local_1e8.y);
  local_74.x = local_1e8.x;
  local_74.y = local_1e8.y;
  local_1e8.x = 2.0;
  local_1e8.y = 1.0;
  local_1e8.command = 1;
  local_1dc = 0;
  local_1d4 = 2;
  local_1d0 = 0x3f80000000000000;
  local_1c8 = 2;
  local_1c4 = 0x3f80000040000000;
  local_1bc = 2;
  local_1b8 = 0x3f80000000000000;
  local_1b0 = 2;
  local_1ac = 0;
  local_1a4 = 2;
  uStack_1a0 = 0;
  uStack_19c = 0;
  uStack_198 = 0x30;
  local_194 = 0;
  local_18c = 0;
  local_248 = (undefined1  [8])&local_23c.y;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_128,(string *)local_248,0xf3);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,8ul>
            ((point (*) [8])&local_1e8,(point (*) [8])&local_c8,(LocationInfo *)local_128);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_248 != (undefined1  [8])&local_23c.y) {
    operator_delete((void *)local_248);
  }
  stroke::remove_all(&local_180);
  stroke::width(&local_180,3.0);
  stroke::add_vertex(&local_180,1.0,2.0,1);
  stroke::add_vertex(&local_180,4.0,6.0,2);
  local_240 = 0;
  local_248 = (undefined1  [8])0x0;
  local_128._8_4_ = stroke::vertex(&local_180,(real_t *)local_248,(real_t *)(local_248 + 4));
  local_128._0_8_ = local_248;
  local_240 = 0;
  local_248 = (undefined1  [8])0x0;
  local_128._20_4_ = stroke::vertex(&local_180,(real_t *)local_248,(real_t *)(local_248 + 4));
  local_128._12_8_ = local_248;
  local_240 = 0;
  local_248 = (undefined1  [8])0x0;
  local_128._32_4_ = stroke::vertex(&local_180,(real_t *)local_248,(real_t *)(local_248 + 4));
  local_128._24_8_ = local_248;
  local_240 = 0;
  local_248 = (undefined1  [8])0x0;
  local_fc = stroke::vertex(&local_180,(real_t *)local_248,(real_t *)(local_248 + 4));
  local_128._36_8_ = local_248;
  local_240 = 0;
  local_248 = (undefined1  [8])0x0;
  local_f0 = stroke::vertex(&local_180,(real_t *)local_248,(real_t *)(local_248 + 4));
  local_f8 = (pointer)local_248;
  local_240 = 0;
  local_248 = (undefined1  [8])0x0;
  local_e4 = stroke::vertex(&local_180,(real_t *)local_248,(real_t *)(local_248 + 4));
  local_ec = (pointer)local_248;
  local_240 = 0;
  local_248 = (undefined1  [8])0x0;
  local_d8 = stroke::vertex(&local_180,(real_t *)local_248,(real_t *)(local_248 + 4));
  local_e0 = (pointer)local_248;
  local_240 = 0;
  local_248 = (undefined1  [8])0x0;
  local_cc = stroke::vertex(&local_180,(real_t *)local_248,(real_t *)(local_248 + 4));
  local_d4 = (pointer)local_248;
  local_248 = (undefined1  [8])0x40a000003fc00000;
  local_240 = 1;
  local_23c.x = 1.0;
  local_23c.y = 2.0;
  local_23c.command = 2;
  local_230 = 0x40c0000040800000;
  local_228 = 2;
  local_224.x = 1.5;
  local_224.y = 5.0;
  local_224.command = 2;
  local_218.x = 4.0;
  local_218.y = 6.0;
  local_218.command = 2;
  local_20c.x = 1.0;
  local_20c.y = 2.0;
  local_20c.command = 2;
  rStack_200 = 0.0;
  rStack_1fc = 0.0;
  iStack_1f8 = 0x30;
  local_1f4.x = 0.0;
  local_1f4.y = 0.0;
  local_1f4.command = 0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_60,0x106);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,8ul>
            ((point (*) [8])local_248,(point (*) [8])local_128,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != &local_40.filename.field_2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  stroke::~stroke(&local_180);
  return;
}

Assistant:

test( StrokerGeneratesSinglePointSequenceForOpenSegment )
			{
				// INIT
				stroke s;

				move_to(s, 0.0f, 0.0f);
				line_to(s, 0.0f, 1.0f);

				s.set_cap(passthrough_cap(amount_alive));
				s.set_join(passthrough_join(amount_alive));
				s.width(4.0f);

				// ACT
				mocks::path::point points1[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(2.0f, 1.0f), lineto(0.0f, 0.0f), lineto(0.0f, 1.0f),
					lineto(2.0f, 1.0f), lineto(0.0f, 1.0f), lineto(0.0f, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.remove_all();
				s.width(3.0f);
				move_to(s, 1.0f, 2.0f);
				line_to(s, 4.0f, 6.0f);

				// ACT
				mocks::path::point points2[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(1.5f, 5.0f), lineto(1.0f, 2.0f), lineto(4.0f, 6.0f),
					lineto(1.5f, 5.0f), lineto(4.0f, 6.0f), lineto(1.0f, 2.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}